

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O1

Vec_Int_t * Gia_ManSimDeriveResets(Gia_Man_t *pGia)

{
  Gia_Obj_t *pGVar1;
  int *piVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  undefined8 uVar5;
  int iVar6;
  void *__s;
  Vec_Int_t *pVVar7;
  int *piVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  Gia_Obj_t *pGVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  timespec ts;
  timespec local_40;
  
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  iVar6 = pGia->nObjs;
  uVar19 = (long)iVar6 * 2;
  iVar16 = (int)uVar19;
  iVar17 = 0x10;
  if (0xe < iVar16 - 1U) {
    iVar17 = iVar16;
  }
  if (iVar17 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar17 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)iVar6 << 3);
  }
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(4000);
  pVVar7->pArray = piVar8;
  iVar17 = pGia->nRegs;
  if (0 < iVar17) {
    iVar22 = 0;
    do {
      iVar3 = pGia->vCos->nSize;
      uVar10 = (iVar3 - iVar17) + iVar22;
      if (((int)uVar10 < 0) || (iVar3 <= (int)uVar10)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar10 = pGia->vCos->pArray[uVar10];
      if (((long)(int)uVar10 < 0) || (pGia->nObjs <= (int)uVar10)) goto LAB_0022482e;
      pGVar4 = pGia->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGVar4 + (int)uVar10;
      uVar14 = (uint)*(ulong *)pGVar1;
      if (uVar10 != (uVar14 & 0x1fffffff)) {
        pGVar18 = (Gia_Obj_t *)
                  ((ulong)(pGVar1 + -(ulong)(uVar14 & 0x1fffffff)) & 0xfffffffffffffffe);
        if ((pGVar18 < pGVar4) || (pGVar4 + pGia->nObjs <= pGVar18)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar17 = (int)((ulong)((long)pGVar18 - (long)pGVar4) >> 2);
        if (iVar17 * -0x55555555 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar10 = (((uint)(*(ulong *)pGVar1 >> 0x1d) ^ (uint)(pGVar1 + -(ulong)(uVar14 & 0x1fffffff))
                  ) & 1) + iVar17 * 0x55555556;
        if (iVar16 <= (int)uVar10) {
LAB_0022480f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar8 = (int *)((long)__s + (ulong)uVar10 * 4);
        *piVar8 = *piVar8 + 1;
        Gia_ManSimCollect(pGia,pGVar1 + -(ulong)((uint)*(ulong *)pGVar1 & 0x1fffffff),pVVar7);
        iVar17 = pVVar7->nSize;
        if (0 < (long)iVar17) {
          piVar8 = pVVar7->pArray;
          lVar12 = 0;
          do {
            iVar3 = piVar8[lVar12];
            if (((long)iVar3 < 0) || (iVar16 <= iVar3)) goto LAB_0022480f;
            piVar2 = (int *)((long)__s + (long)iVar3 * 4);
            *piVar2 = *piVar2 + 1;
            lVar12 = lVar12 + 1;
          } while (iVar17 != lVar12);
        }
      }
      iVar22 = iVar22 + 1;
      iVar17 = pGia->nRegs;
    } while (iVar22 < iVar17);
  }
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
    pVVar7->pArray = (int *)0x0;
  }
  free(pVVar7);
  iVar17 = pGia->nObjs;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar22 = 0x10;
  if (0xe < iVar17 - 1U) {
    iVar22 = iVar17;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar22;
  if (iVar22 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar22 << 2);
  }
  pVVar7->pArray = piVar8;
  pVVar7->nSize = iVar17;
  if (piVar8 != (int *)0x0) {
    memset(piVar8,0xff,(long)iVar17 << 2);
  }
  if (iVar6 < 1) {
    uVar14 = 0;
    uVar10 = 0;
    uVar21 = 0;
    uVar19 = 0;
  }
  else {
    uVar9 = 1;
    if (1 < iVar16) {
      uVar9 = uVar19 & 0xffffffff;
    }
    uVar13 = 0;
    uVar19 = 0;
    uVar21 = 0;
    uVar10 = 0;
    uVar14 = 0;
    do {
      if (4 < *(int *)((long)__s + uVar13 * 4)) {
        uVar20 = uVar13 >> 1 & 0x7fffffff;
        iVar6 = (int)uVar20;
        if (pGia->nObjs <= iVar6) {
LAB_0022482e:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar4 = pGia->pObjs;
        if ((uVar13 & 1) == 0) {
          if (iVar17 <= iVar6) {
LAB_0022486c:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          piVar8[uVar20] = 1;
          uVar5 = *(undefined8 *)(pGVar4 + uVar20);
          uVar15 = 0;
          if (((uint)uVar5 & 0x9fffffff) == 0x9fffffff) {
            uVar15 = (uint)((int)((uint)((ulong)uVar5 >> 0x20) & 0x1fffffff) <
                           pGia->vCis->nSize - pGia->nRegs);
          }
          uVar19 = (ulong)((int)uVar19 + uVar15);
          uVar10 = uVar10 + 1;
        }
        else {
          if (iVar17 <= iVar6) goto LAB_0022486c;
          piVar8[uVar20] = 0;
          uVar5 = *(undefined8 *)(pGVar4 + uVar20);
          uVar15 = 0;
          if (((uint)uVar5 & 0x9fffffff) == 0x9fffffff) {
            uVar15 = (uint)((int)((uint)((ulong)uVar5 >> 0x20) & 0x1fffffff) <
                           pGia->vCis->nSize - pGia->nRegs);
          }
          uVar21 = uVar21 + uVar15;
          uVar14 = uVar14 + 1;
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar9 != uVar13);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  printf("Logic0 = %d (%d). Logic1 = %d (%d). ",(ulong)uVar14,(ulong)uVar21,(ulong)uVar10,uVar19);
  iVar16 = 3;
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(iVar16,"%s =","Time");
  Abc_Print(iVar16,"%9.2f sec\n",(double)(lVar12 + lVar11) / 1000000.0);
  return pVVar7;
}

Assistant:

Vec_Int_t * Gia_ManSimDeriveResets( Gia_Man_t * pGia )
{
    int nImpLimit = 5;
    Vec_Int_t * vResult;
    Vec_Int_t * vCountLits, * vSuperGate;
    Gia_Obj_t * pObj;
    int i, k, Lit, Count;
    int Counter0 = 0, Counter1 = 0;
    int CounterPi0 = 0, CounterPi1 = 0;
    abctime clk = Abc_Clock();

    // create reset counters for each literal
    vCountLits = Vec_IntStart( 2 * Gia_ManObjNum(pGia) );

    // collect implications for each flop input driver
    vSuperGate = Vec_IntAlloc( 1000 );
    Gia_ManForEachRi( pGia, pObj, i )
    {
        if ( Gia_ObjFaninId0p(pGia, pObj) == 0 )
            continue;
        Vec_IntAddToEntry( vCountLits, Gia_ObjToLit(pGia, Gia_ObjChild0(pObj)), 1 );
        Gia_ManSimCollect( pGia, Gia_ObjFanin0(pObj), vSuperGate );
        Vec_IntForEachEntry( vSuperGate, Lit, k )
            Vec_IntAddToEntry( vCountLits, Lit, 1 );
    }
    Vec_IntFree( vSuperGate );

    // label signals whose counter if more than the limit
    vResult = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    Vec_IntForEachEntry( vCountLits, Count, Lit )
    {
        if ( Count < nImpLimit )
            continue;
        pObj = Gia_ManObj( pGia, Abc_Lit2Var(Lit) );
        if ( Abc_LitIsCompl(Lit) ) // const 0
        {
//            Ssm_ObjSetLogic0( pObj );
            Vec_IntWriteEntry( vResult, Abc_Lit2Var(Lit), 0 );
            CounterPi0 += Gia_ObjIsPi(pGia, pObj);
            Counter0++;
        }
        else
        {
//            Ssm_ObjSetLogic1( pObj );
            Vec_IntWriteEntry( vResult, Abc_Lit2Var(Lit), 1 );
            CounterPi1 += Gia_ObjIsPi(pGia, pObj);
            Counter1++;
        }
//        if ( Gia_ObjIsPi(pGia, pObj) )
//            printf( "%d ", Count );
    }
//    printf( "\n" );
    Vec_IntFree( vCountLits );

    printf( "Logic0 = %d (%d). Logic1 = %d (%d). ", Counter0, CounterPi0, Counter1, CounterPi1 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return vResult;
}